

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_int(char *data,int64_t num)

{
  char *pcVar1;
  int64_t num_local;
  char *data_local;
  
  if (num < 0) {
    if (num < -0x20) {
      if (num < -0x80) {
        if (num < -0x8000) {
          if (num < -0x80000000) {
            pcVar1 = mp_store_u8(data,0xd3);
            data_local = mp_store_u64(pcVar1,num);
          }
          else {
            pcVar1 = mp_store_u8(data,0xd2);
            data_local = mp_store_u32(pcVar1,(uint32_t)num);
          }
        }
        else {
          pcVar1 = mp_store_u8(data,0xd1);
          data_local = mp_store_u16(pcVar1,(uint16_t)num);
        }
      }
      else {
        pcVar1 = mp_store_u8(data,0xd0);
        data_local = mp_store_u8(pcVar1,(byte)num);
      }
    }
    else {
      data_local = mp_store_u8(data,(byte)num | 0xe0);
    }
    return data_local;
  }
  __assert_fail("num < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                ,0x6fb,"char *mp_encode_int(char *, int64_t)");
}

Assistant:

MP_IMPL char *
mp_encode_int(char *data, int64_t num)
{
	assert(num < 0);
	if (num >= -0x20) {
		return mp_store_u8(data, (uint8_t)(0xe0 | num));
	} else if (num >= INT8_MIN) {
		data = mp_store_u8(data, 0xd0);
		return mp_store_u8(data, (uint8_t)num);
	} else if (num >= INT16_MIN) {
		data = mp_store_u8(data, 0xd1);
		return mp_store_u16(data, (uint16_t)num);
	} else if (num >= INT32_MIN) {
		data = mp_store_u8(data, 0xd2);
		return mp_store_u32(data, (uint32_t)num);
	} else {
		data = mp_store_u8(data, 0xd3);
		return mp_store_u64(data, num);
	}
}